

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Liby::Socket::listen(Socket *this,int __fd,int __n)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint extraout_EAX;
  undefined1 local_24 [4];
  in_addr in_addr1;
  sockaddr_in address;
  int reuse;
  Socket *this_local;
  
  unique0x10000132 = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->fp_);
  if (!bVar1) {
    createSocket(this);
  }
  setNoblock(this,true);
  address.sin_zero[0] = '\x01';
  address.sin_zero[1] = '\0';
  address.sin_zero[2] = '\0';
  address.sin_zero[3] = '\0';
  iVar3 = setsockopt(this->fd_,1,2,address.sin_zero,4);
  if (iVar3 < 0) {
    throw_err();
  }
  local_24._0_2_ = 2;
  in_addr1.s_addr = (this->ep_).addr_;
  local_24._2_2_ = (this->ep_).port_;
  iVar3 = bind(this->fd_,(sockaddr *)local_24,0x10);
  if (iVar3 < 0) {
    throw_err();
  }
  bVar2 = this->isUdp_ & 1;
  uVar4 = (uint)bVar2;
  if (bVar2 == 0) {
    uVar4 = ::listen(this->fd_,0x14);
    if ((int)uVar4 < 0) {
      throw_err();
      uVar4 = extraout_EAX;
    }
  }
  return uVar4;
}

Assistant:

void Socket::listen() {
    if (!fp_) {
        createSocket();
    }

    setNoblock();

    int reuse = 1;
    if (::setsockopt(fd_, SOL_SOCKET, SO_REUSEADDR, &reuse, sizeof(int)) < 0) {
        throw_err();
    }

    struct sockaddr_in address;
    address.sin_family = AF_INET;
    //    address.sin_len = sizeof(address);
    struct in_addr in_addr1;
    in_addr1.s_addr = ep_.addr_;
    address.sin_addr = in_addr1;
    address.sin_port = ep_.port_;

    if (::bind(fd_, (struct sockaddr *)&address, sizeof(address)) < 0) {
        throw_err();
    }
    if (isUdp_ == false && ::listen(fd_, 20) < 0) {
        throw_err();
    }
}